

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::SetSecurePendingDataset
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aMaxRetrievalTimer,
          PendingOperationalDataset *aDataset)

{
  anon_class_272_4_c83933d0 local_158;
  AsyncRequest local_48;
  PendingOperationalDataset *local_28;
  PendingOperationalDataset *aDataset_local;
  ErrorHandler *pEStack_18;
  uint32_t aMaxRetrievalTimer_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_158.this = this;
  local_28 = aDataset;
  aDataset_local._4_4_ = aMaxRetrievalTimer;
  pEStack_18 = aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_158.aHandler,aHandler);
  local_158.aMaxRetrievalTimer = aDataset_local._4_4_;
  PendingOperationalDataset::PendingOperationalDataset(&local_158.aDataset,local_28);
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)::__0,void>
            ((function<void()> *)&local_48,&local_158);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  SetSecurePendingDataset(std::function<void(ot::commissioner::Error)>,unsigned_int,ot::commissioner::PendingOperationalDataset_const&)
  ::$_0::~__0((__0 *)&local_158);
  return;
}

Assistant:

void CommissionerSafe::SetSecurePendingDataset(ErrorHandler                     aHandler,
                                               uint32_t                         aMaxRetrievalTimer,
                                               const PendingOperationalDataset &aDataset)
{
    PushAsyncRequest([=]() { mImpl->SetSecurePendingDataset(aHandler, aMaxRetrievalTimer, aDataset); });
}